

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int luv_udp_getsockname(lua_State *L)

{
  int status;
  int local_a4;
  int ret;
  int addrlen;
  sockaddr_storage address;
  uv_udp_t *handle;
  lua_State *L_local;
  
  address.__ss_align = (unsigned_long)luv_check_udp(L,1);
  local_a4 = 0x80;
  status = uv_udp_getsockname((uv_udp_t *)address.__ss_align,(sockaddr *)&ret,&local_a4);
  if (status < 0) {
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    parse_sockaddr(L,(sockaddr_storage *)&ret,local_a4);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_udp_getsockname(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  struct sockaddr_storage address;
  int addrlen = sizeof(address);
  int ret = uv_udp_getsockname(handle, (struct sockaddr*)&address, &addrlen);
  if (ret < 0) return luv_error(L, ret);
  parse_sockaddr(L, &address);
  return 1;
}